

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_exit_tb(DisasContext_conflict2 *s)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  update_cc_op(s);
  tcg_gen_movi_i32(tcg_ctx_00,QREG_PC,s->pc);
  (s->base).is_jmp = DISAS_TARGET_1;
  return;
}

Assistant:

static void gen_exit_tb(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    update_cc_op(s);
    tcg_gen_movi_i32(tcg_ctx, QREG_PC, s->pc);
    s->base.is_jmp = DISAS_EXIT;
}